

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

bool __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::IsCompatibleWith
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          IPipelineResourceSignature *pPRS)

{
  Uint32 UVar1;
  bool bVar2;
  PipelineResourceAttribsType *pPVar3;
  PipelineResourceAttribsType *pPVar4;
  char (*in_RCX) [42];
  Uint32 r;
  Uint32 ResIndex;
  bool bVar5;
  string msg;
  string local_50;
  
  if (pPRS == (IPipelineResourceSignature *)0x0) {
    bVar5 = (this->
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
            ).m_Desc.NumImmutableSamplers == 0 &&
            (this->
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
            ).m_Desc.NumResources == 0;
  }
  else if (this == (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)pPRS) {
    bVar5 = true;
  }
  else {
    CheckDynamicType<Diligent::PipelineResourceSignatureVkImpl_const,Diligent::IPipelineResourceSignature_const>
              (pPRS);
    if ((_func_int **)this->m_Hash == pPRS[0x13].super_IDeviceObject.super_IObject._vptr_IObject) {
      bVar5 = false;
      bVar2 = PipelineResourceSignaturesCompatible
                        (&(this->
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          ).m_Desc,(PipelineResourceSignatureDesc *)(pPRS + 3),false);
      if (bVar2) {
        UVar1 = (this->
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                ).m_Desc.NumResources;
        if (UVar1 != *(Uint32 *)&pPRS[5].super_IDeviceObject.super_IObject._vptr_IObject) {
          FormatString<char[26],char[42]>
                    (&local_50,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"ResCount == Other.GetTotalResourceCount()",in_RCX);
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"IsCompatibleWith",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x266);
          std::__cxx11::string::~string((string *)&local_50);
        }
        ResIndex = 0;
        do {
          bVar5 = UVar1 == ResIndex;
          if (bVar5) {
            return bVar5;
          }
          pPVar3 = GetResourceAttribs(this,ResIndex);
          pPVar4 = GetResourceAttribs((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *
                                      )pPRS,ResIndex);
          ResIndex = ResIndex + 1;
        } while (((*(ulong *)pPVar4 ^ *(ulong *)pPVar3) & 0xffffffff0000ffff) == 0);
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

IsCompatibleWith(const IPipelineResourceSignature* pPRS) const override final
    {
        if (pPRS == nullptr)
            return IsEmpty();

        if (this == pPRS)
            return true;

        const PipelineResourceSignatureImplType& This  = *static_cast<const PipelineResourceSignatureImplType*>(this);
        const PipelineResourceSignatureImplType& Other = *ClassPtrCast<const PipelineResourceSignatureImplType>(pPRS);

        if (This.GetHash() != Other.GetHash())
            return false;

        if (!PipelineResourceSignaturesCompatible(This.GetDesc(), Other.GetDesc()))
            return false;

        const Uint32 ResCount = This.GetTotalResourceCount();
        VERIFY_EXPR(ResCount == Other.GetTotalResourceCount());
        for (Uint32 r = 0; r < ResCount; ++r)
        {
            const PipelineResourceAttribsType& Res      = This.GetResourceAttribs(r);
            const PipelineResourceAttribsType& OtherRes = Other.GetResourceAttribs(r);
            if (!Res.IsCompatibleWith(OtherRes))
                return false;
        }

        return true;
    }